

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O0

deBool qpTestLog_writeEglConfig(qpTestLog *log,qpEglConfigInfo *config)

{
  deBool dVar1;
  long lVar2;
  undefined1 local_bf0 [16];
  char *local_be0;
  char *local_bd8;
  undefined1 local_bd0 [16];
  char *local_bc0;
  char *local_bb8;
  undefined1 local_bb0 [16];
  char *local_ba0;
  char *local_b98;
  undefined1 local_b90 [16];
  char *local_b80;
  char *local_b78;
  undefined1 local_b70 [16];
  char *local_b60;
  char *local_b58;
  undefined1 local_b50 [16];
  char *local_b40;
  char *local_b38;
  undefined1 local_b30 [16];
  char *local_b20;
  char *local_b18;
  undefined1 local_b10 [16];
  char *local_b00;
  char *local_af8;
  undefined1 local_af0 [16];
  char *local_ae0;
  char *local_ad8;
  undefined1 local_ad0 [16];
  char *local_ac0;
  char *local_ab8;
  undefined1 local_ab0 [16];
  char *local_aa0;
  char *local_a98;
  undefined1 local_a90 [16];
  char *local_a80;
  char *local_a78;
  undefined1 local_a70 [16];
  char *local_a60;
  char *local_a58;
  undefined1 local_a50 [16];
  char *local_a40;
  char *local_a38;
  undefined1 local_a30 [16];
  char *local_a20;
  char *local_a18;
  undefined1 local_a10 [16];
  char *local_a00;
  char *local_9f8;
  undefined1 local_9f0 [16];
  char *local_9e0;
  char *local_9d8;
  undefined1 local_9d0 [16];
  char *local_9c0;
  char *local_9b8;
  undefined1 local_9b0 [16];
  char *local_9a0;
  char *local_998;
  undefined1 local_990 [16];
  char *local_980;
  char *local_978;
  undefined1 local_970 [16];
  char *local_960;
  char *local_958;
  undefined1 local_950 [16];
  char *local_940;
  char *local_938;
  undefined1 local_930 [16];
  char *local_920;
  char *local_918;
  undefined1 local_910 [16];
  char *local_900;
  char *local_8f8;
  undefined1 local_8f0 [16];
  char *local_8e0;
  char *local_8d8;
  undefined1 local_8d0 [16];
  char *local_8c0;
  char *local_8b8;
  undefined1 local_8b0 [16];
  char *local_8a0;
  char *local_898;
  undefined1 local_890 [16];
  char *local_880;
  char *local_878;
  undefined1 local_870 [16];
  char *local_860;
  char *local_858;
  undefined1 local_850 [16];
  char *local_840;
  char *local_838;
  int local_82c;
  undefined1 local_828 [4];
  int numAttribs;
  qpXmlAttribute attribs [64];
  qpEglConfigInfo *config_local;
  qpTestLog *log_local;
  
  local_82c = 0;
  deMutex_lock(log->lock);
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_850,"BufferSize",config->bufferSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_850._0_8_;
  attribs[lVar2].name = (char *)local_850._8_8_;
  *(char **)&attribs[lVar2].type = local_840;
  attribs[lVar2].stringValue = local_838;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_870,"RedSize",config->redSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_870._0_8_;
  attribs[lVar2].name = (char *)local_870._8_8_;
  *(char **)&attribs[lVar2].type = local_860;
  attribs[lVar2].stringValue = local_858;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_890,"GreenSize",config->greenSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_890._0_8_;
  attribs[lVar2].name = (char *)local_890._8_8_;
  *(char **)&attribs[lVar2].type = local_880;
  attribs[lVar2].stringValue = local_878;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_8b0,"BlueSize",config->blueSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_8b0._0_8_;
  attribs[lVar2].name = (char *)local_8b0._8_8_;
  *(char **)&attribs[lVar2].type = local_8a0;
  attribs[lVar2].stringValue = local_898;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_8d0,"LuminanceSize",config->luminanceSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_8d0._0_8_;
  attribs[lVar2].name = (char *)local_8d0._8_8_;
  *(char **)&attribs[lVar2].type = local_8c0;
  attribs[lVar2].stringValue = local_8b8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_8f0,"AlphaSize",config->alphaSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_8f0._0_8_;
  attribs[lVar2].name = (char *)local_8f0._8_8_;
  *(char **)&attribs[lVar2].type = local_8e0;
  attribs[lVar2].stringValue = local_8d8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_910,"AlphaMaskSize",config->alphaMaskSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_910._0_8_;
  attribs[lVar2].name = (char *)local_910._8_8_;
  *(char **)&attribs[lVar2].type = local_900;
  attribs[lVar2].stringValue = local_8f8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetBoolAttrib((qpXmlAttribute *)local_930,"BindToTextureRGB",config->bindToTextureRGB);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_930._0_8_;
  attribs[lVar2].name = (char *)local_930._8_8_;
  *(char **)&attribs[lVar2].type = local_920;
  attribs[lVar2].stringValue = local_918;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetBoolAttrib((qpXmlAttribute *)local_950,"BindToTextureRGBA",config->bindToTextureRGBA);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_950._0_8_;
  attribs[lVar2].name = (char *)local_950._8_8_;
  *(char **)&attribs[lVar2].type = local_940;
  attribs[lVar2].stringValue = local_938;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_970,"ColorBufferType",config->colorBufferType);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_970._0_8_;
  attribs[lVar2].name = (char *)local_970._8_8_;
  *(char **)&attribs[lVar2].type = local_960;
  attribs[lVar2].stringValue = local_958;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_990,"ConfigCaveat",config->configCaveat);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_990._0_8_;
  attribs[lVar2].name = (char *)local_990._8_8_;
  *(char **)&attribs[lVar2].type = local_980;
  attribs[lVar2].stringValue = local_978;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_9b0,"ConfigID",config->configID);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_9b0._0_8_;
  attribs[lVar2].name = (char *)local_9b0._8_8_;
  *(char **)&attribs[lVar2].type = local_9a0;
  attribs[lVar2].stringValue = local_998;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_9d0,"Conformant",config->conformant);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_9d0._0_8_;
  attribs[lVar2].name = (char *)local_9d0._8_8_;
  *(char **)&attribs[lVar2].type = local_9c0;
  attribs[lVar2].stringValue = local_9b8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_9f0,"DepthSize",config->depthSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_9f0._0_8_;
  attribs[lVar2].name = (char *)local_9f0._8_8_;
  *(char **)&attribs[lVar2].type = local_9e0;
  attribs[lVar2].stringValue = local_9d8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_a10,"Level",config->level);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_a10._0_8_;
  attribs[lVar2].name = (char *)local_a10._8_8_;
  *(char **)&attribs[lVar2].type = local_a00;
  attribs[lVar2].stringValue = local_9f8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_a30,"MaxPBufferWidth",config->maxPBufferWidth);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_a30._0_8_;
  attribs[lVar2].name = (char *)local_a30._8_8_;
  *(char **)&attribs[lVar2].type = local_a20;
  attribs[lVar2].stringValue = local_a18;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_a50,"MaxPBufferHeight",config->maxPBufferHeight);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_a50._0_8_;
  attribs[lVar2].name = (char *)local_a50._8_8_;
  *(char **)&attribs[lVar2].type = local_a40;
  attribs[lVar2].stringValue = local_a38;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_a70,"MaxPBufferPixels",config->maxPBufferPixels);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_a70._0_8_;
  attribs[lVar2].name = (char *)local_a70._8_8_;
  *(char **)&attribs[lVar2].type = local_a60;
  attribs[lVar2].stringValue = local_a58;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_a90,"MaxSwapInterval",config->maxSwapInterval);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_a90._0_8_;
  attribs[lVar2].name = (char *)local_a90._8_8_;
  *(char **)&attribs[lVar2].type = local_a80;
  attribs[lVar2].stringValue = local_a78;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_ab0,"MinSwapInterval",config->minSwapInterval);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_ab0._0_8_;
  attribs[lVar2].name = (char *)local_ab0._8_8_;
  *(char **)&attribs[lVar2].type = local_aa0;
  attribs[lVar2].stringValue = local_a98;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetBoolAttrib((qpXmlAttribute *)local_ad0,"NativeRenderable",config->nativeRenderable);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_ad0._0_8_;
  attribs[lVar2].name = (char *)local_ad0._8_8_;
  *(char **)&attribs[lVar2].type = local_ac0;
  attribs[lVar2].stringValue = local_ab8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_af0,"RenderableType",config->renderableType);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_af0._0_8_;
  attribs[lVar2].name = (char *)local_af0._8_8_;
  *(char **)&attribs[lVar2].type = local_ae0;
  attribs[lVar2].stringValue = local_ad8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_b10,"SampleBuffers",config->sampleBuffers);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_b10._0_8_;
  attribs[lVar2].name = (char *)local_b10._8_8_;
  *(char **)&attribs[lVar2].type = local_b00;
  attribs[lVar2].stringValue = local_af8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_b30,"Samples",config->samples);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_b30._0_8_;
  attribs[lVar2].name = (char *)local_b30._8_8_;
  *(char **)&attribs[lVar2].type = local_b20;
  attribs[lVar2].stringValue = local_b18;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_b50,"StencilSize",config->stencilSize);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_b50._0_8_;
  attribs[lVar2].name = (char *)local_b50._8_8_;
  *(char **)&attribs[lVar2].type = local_b40;
  attribs[lVar2].stringValue = local_b38;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_b70,"SurfaceTypes",config->surfaceTypes);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_b70._0_8_;
  attribs[lVar2].name = (char *)local_b70._8_8_;
  *(char **)&attribs[lVar2].type = local_b60;
  attribs[lVar2].stringValue = local_b58;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetStringAttrib((qpXmlAttribute *)local_b90,"TransparentType",config->transparentType);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_b90._0_8_;
  attribs[lVar2].name = (char *)local_b90._8_8_;
  *(char **)&attribs[lVar2].type = local_b80;
  attribs[lVar2].stringValue = local_b78;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_bb0,"TransparentRedValue",config->transparentRedValue);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_bb0._0_8_;
  attribs[lVar2].name = (char *)local_bb0._8_8_;
  *(char **)&attribs[lVar2].type = local_ba0;
  attribs[lVar2].stringValue = local_b98;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_bd0,"TransparentGreenValue",config->transparentGreenValue);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_bd0._0_8_;
  attribs[lVar2].name = (char *)local_bd0._8_8_;
  *(char **)&attribs[lVar2].type = local_bc0;
  attribs[lVar2].stringValue = local_bb8;
  lVar2 = (long)local_82c;
  local_82c = local_82c + 1;
  qpSetIntAttrib((qpXmlAttribute *)local_bf0,"TransparentBlueValue",config->transparentBlueValue);
  *(undefined8 *)(local_828 + lVar2 * 0x20) = local_bf0._0_8_;
  attribs[lVar2].name = (char *)local_bf0._8_8_;
  *(char **)&attribs[lVar2].type = local_be0;
  attribs[lVar2].stringValue = local_bd8;
  dVar1 = qpXmlWriter_startElement(log->writer,"EglConfig",local_82c,(qpXmlAttribute *)local_828);
  if ((dVar1 != 0) && (dVar1 = qpXmlWriter_endElement(log->writer,"EglConfig"), dVar1 != 0)) {
    deMutex_unlock(log->lock);
    return 1;
  }
  qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
  deMutex_unlock(log->lock);
  return 0;
}

Assistant:

deBool qpTestLog_writeEglConfig (qpTestLog* log, const qpEglConfigInfo* config)
{
	qpXmlAttribute	attribs[64];
	int				numAttribs = 0;

	DE_ASSERT(log && config);
	deMutex_lock(log->lock);

	attribs[numAttribs++] = qpSetIntAttrib		("BufferSize", config->bufferSize);
	attribs[numAttribs++] = qpSetIntAttrib		("RedSize", config->redSize);
	attribs[numAttribs++] = qpSetIntAttrib		("GreenSize", config->greenSize);
	attribs[numAttribs++] = qpSetIntAttrib		("BlueSize", config->blueSize);
	attribs[numAttribs++] = qpSetIntAttrib		("LuminanceSize", config->luminanceSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaSize", config->alphaSize);
	attribs[numAttribs++] = qpSetIntAttrib		("AlphaMaskSize", config->alphaMaskSize);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGB", config->bindToTextureRGB);
	attribs[numAttribs++] = qpSetBoolAttrib		("BindToTextureRGBA", config->bindToTextureRGBA);
	attribs[numAttribs++] = qpSetStringAttrib	("ColorBufferType", config->colorBufferType);
	attribs[numAttribs++] = qpSetStringAttrib	("ConfigCaveat", config->configCaveat);
	attribs[numAttribs++] = qpSetIntAttrib		("ConfigID", config->configID);
	attribs[numAttribs++] = qpSetStringAttrib	("Conformant", config->conformant);
	attribs[numAttribs++] = qpSetIntAttrib		("DepthSize", config->depthSize);
	attribs[numAttribs++] = qpSetIntAttrib		("Level", config->level);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferWidth", config->maxPBufferWidth);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferHeight", config->maxPBufferHeight);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxPBufferPixels", config->maxPBufferPixels);
	attribs[numAttribs++] = qpSetIntAttrib		("MaxSwapInterval", config->maxSwapInterval);
	attribs[numAttribs++] = qpSetIntAttrib		("MinSwapInterval", config->minSwapInterval);
	attribs[numAttribs++] = qpSetBoolAttrib		("NativeRenderable", config->nativeRenderable);
	attribs[numAttribs++] = qpSetStringAttrib	("RenderableType", config->renderableType);
	attribs[numAttribs++] = qpSetIntAttrib		("SampleBuffers", config->sampleBuffers);
	attribs[numAttribs++] = qpSetIntAttrib		("Samples", config->samples);
	attribs[numAttribs++] = qpSetIntAttrib		("StencilSize", config->stencilSize);
	attribs[numAttribs++] = qpSetStringAttrib	("SurfaceTypes", config->surfaceTypes);
	attribs[numAttribs++] = qpSetStringAttrib	("TransparentType", config->transparentType);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentRedValue", config->transparentRedValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentGreenValue", config->transparentGreenValue);
	attribs[numAttribs++] = qpSetIntAttrib		("TransparentBlueValue", config->transparentBlueValue);
	DE_ASSERT(numAttribs <= DE_LENGTH_OF_ARRAY(attribs));

	if (!qpXmlWriter_startElement(log->writer, "EglConfig", numAttribs, attribs) ||
		!qpXmlWriter_endElement(log->writer, "EglConfig"))
	{
		qpPrintf("qpTestLog_writeEglConfig(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);
	return DE_TRUE;
}